

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tcb::unicode::
to_utf_string<char,std::istreambuf_iterator<char,std::char_traits<char>>,std::istreambuf_iterator<char,std::char_traits<char>>,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,unicode *this,istreambuf_iterator<char,_std::char_traits<char>_> first,
          istreambuf_iterator<char,_std::char_traits<char>_> last)

{
  istreambuf_iterator<char,_std::char_traits<char>_> last_00;
  istreambuf_iterator<char,_std::char_traits<char>_> first_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  last_00._8_8_ = (ulong)last._M_sbuf & 0xffffffff;
  last_00._M_sbuf = first._8_8_;
  first_00._M_c = (int)first._M_sbuf;
  first_00._M_sbuf = (streambuf_type *)this;
  first_00._12_4_ = 0;
  utf_convert<char,std::istreambuf_iterator<char,std::char_traits<char>>,std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>,char>
            (first_00,last_00,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<OutCharT>
to_utf_string(InputIt first, Sentinel last)
{
    using string_type = std::basic_string<OutCharT>;

    string_type output;

    // Try to minimise the number of reallocations
    if /*constexpr*/ (std::is_same<typename std::iterator_traits<InputIt>::iterator_category,
                                   std::random_access_iterator_tag>::value) {
        output.reserve(static_cast<typename string_type::size_type>(std::distance(first, last)));
    }

    utf_convert<OutCharT>(first, last, std::back_inserter(output));

    return output;
}